

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt5.cpp
# Opt level: O1

int __thiscall crnlib::qdxt5::init(qdxt5 *this,EVP_PKEY_CTX *ctx)

{
  vec2F_clusterizer *this_00;
  mip_desc *pmVar1;
  uint *puVar2;
  int *piVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  pair<crnlib::vec<2U,_float>,_unsigned_int> *ppVar7;
  dxt_pixel_block *pdVar8;
  double dVar9;
  double dVar10;
  bool bVar11;
  char cVar12;
  bool bVar13;
  uint uVar14;
  crn_thread_id_t cVar15;
  uint uVar16;
  int iVar17;
  void *in_RCX;
  ulong uVar18;
  undefined1 *puVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  dxt_pixel_block *in_RDX;
  long lVar23;
  ulong uVar24;
  uchar *puVar25;
  uint l;
  uint uVar26;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *v;
  undefined8 uVar27;
  uint uVar28;
  ulong uVar29;
  int iVar30;
  long lVar31;
  uint uVar32;
  uint x;
  long lVar33;
  uchar uVar34;
  uint uVar35;
  int iVar36;
  uint e;
  ulong uVar37;
  uint uVar38;
  uint *puVar39;
  undefined4 *puVar40;
  int iVar41;
  ulong uVar42;
  uint uVar43;
  uint uVar44;
  float fVar45;
  float fVar46;
  undefined4 uVar47;
  undefined4 uVar48;
  double dVar49;
  training_vec_array *training_vecs;
  color_quad_u8 h;
  color_quad_u8 l_1;
  uint encoding_hist [8];
  image_u8 debug_img;
  uint c [8];
  color_quad_u8 layout_pixels [64];
  hash_map<unsigned_long_long,_crnlib::empty_type,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
  selector_hash;
  color_quad_u8 chunk_pixels [64];
  uint local_64c;
  int local_648;
  uint local_644;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_604;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_600;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_5fc;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  mip_desc *local_5e8;
  ulong local_5e0;
  ulong local_5d8;
  ulong local_5d0;
  ulong local_5c8;
  long local_5c0;
  unsigned_long_long local_5b8 [5];
  ulong local_590;
  undefined4 *local_588;
  uint *local_580;
  undefined4 *local_578;
  long local_570;
  ulong local_568;
  ulong local_560;
  image<crnlib::color_quad<unsigned_char,_int>_> local_558;
  empty_type local_528 [32];
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_508 [64];
  hash_map<unsigned_long_long,_crnlib::empty_type,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
  local_408 [2];
  long local_3c0 [81];
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_138;
  float local_134;
  
  v = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)((ulong)ctx & 0xffffffff);
  clear(this);
  cVar15 = crn_get_current_thread_id();
  this->m_main_thread_id = cVar15;
  this->m_num_blocks = (uint)ctx;
  this->m_pBlocks = in_RDX;
  memcpy(&this->m_params,in_RCX,0x62d);
  this_00 = &this->m_endpoint_clusterizer;
  vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_>::reserve
            (&this_00->m_training_vecs,(uint)ctx);
  this->m_progress_start = 0;
  this->m_progress_range = 0x4b;
  local_558.m_width = 0;
  local_558.m_height = 0;
  local_558.m_pitch = 0;
  local_558.m_total = 0;
  local_558.m_comp_flags = 0xf;
  local_558.m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
  local_558.m_pixel_buf.m_p = (color_quad<unsigned_char,_int> *)0x0;
  local_558.m_pixel_buf.m_size = 0;
  local_558.m_pixel_buf.m_capacity = 0;
  if (((this->m_params).m_hierarchical == true) && ((this->m_params).m_num_mips != 0)) {
    uVar16 = this->m_num_blocks;
    v = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)(ulong)uVar16;
    uVar38 = (this->m_endpoint_clusterizer).m_training_vecs.m_size;
    if (uVar38 != uVar16) {
      if (uVar38 <= uVar16) {
        if ((this->m_endpoint_clusterizer).m_training_vecs.m_capacity < uVar16) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)this_00,uVar16,uVar38 + 1 == uVar16,0xc,
                     vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_>::object_mover,false);
        }
        uVar38 = (this->m_endpoint_clusterizer).m_training_vecs.m_size;
        uVar14 = uVar16 - uVar38;
        if (uVar14 != 0) {
          ppVar7 = (this->m_endpoint_clusterizer).m_training_vecs.m_p;
          lVar23 = 0;
          do {
            *(undefined4 *)((long)(&ppVar7[uVar38].first + 1) + lVar23) = 0;
            lVar23 = lVar23 + 0xc;
          } while ((ulong)uVar14 * 0xc != lVar23);
        }
      }
      (this->m_endpoint_clusterizer).m_training_vecs.m_size = uVar16;
    }
    local_5b8[2] = 0;
    local_5b8[3] = 0;
    local_5b8[0] = 0;
    local_5b8[1] = 0;
    if ((this->m_params).m_num_mips != 0) {
      local_5e8 = (this->m_params).m_mip_desc;
      local_64c = 0x200;
      uVar18 = 0;
      local_588 = &DAT_001cf674;
      v = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)
          CONCAT71((uint7)(uint3)(uVar16 >> 8),0xff);
      local_644 = 0;
      do {
        uVar22 = local_5e8[uVar18].m_block_width;
        uVar4 = local_5e8[uVar18].m_block_height;
        uVar16 = uVar22 + 1;
        uVar38 = uVar4 + 1;
        uVar14 = uVar38 >> 1;
        local_5fc.m_u32 = 0xff000000;
        image<crnlib::color_quad<unsigned_char,_int>_>::resize
                  (&local_558,(uVar16 >> 1) * 8,uVar14 * 8,0xffffffff,
                   (color_quad<unsigned_char,_int> *)&local_5fc.field_0);
        cVar12 = '\x05';
        if (1 < uVar38) {
          pmVar1 = local_5e8 + uVar18;
          uVar38 = uVar4 * 4 - 1;
          uVar42 = (ulong)(uVar22 * 4 - 1);
          local_590 = (ulong)(uVar16 >> 1);
          uVar37 = (ulong)uVar14;
          iVar21 = 0;
          local_648 = 0;
          uVar29 = 0;
          local_5e0 = uVar37;
          local_5c8 = uVar42;
          do {
            cVar12 = '\b';
            bVar13 = 1 < uVar16;
            if (1 < uVar16) {
              local_570 = uVar29 * 8;
              local_560 = (ulong)(uint)((int)uVar29 * 2);
              iVar17 = 0;
              iVar41 = 0;
              lVar23 = 0;
              uVar24 = 0;
              local_5d8 = uVar29;
              do {
                uVar22 = pmVar1->m_first_block;
                uVar4 = pmVar1->m_block_width;
                pdVar8 = this->m_pBlocks;
                puVar25 = local_138.c + 3;
                lVar31 = 0;
                do {
                  uVar14 = (int)local_570 + (int)lVar31;
                  if (uVar38 <= uVar14) {
                    uVar14 = uVar38;
                  }
                  uVar37 = (ulong)((uVar14 & 3) << 4);
                  lVar33 = 0;
                  do {
                    uVar35 = (int)lVar33 + (int)lVar23;
                    if ((uint)uVar42 <= uVar35) {
                      uVar35 = (uint)uVar42;
                    }
                    uVar43 = (uVar35 >> 2) + (uVar14 >> 2) * uVar4 + uVar22;
                    uVar35 = uVar35 & 3;
                    puVar25[lVar33 * 4 + -3] = pdVar8[uVar43].m_pixels[0][uVar35].field_0.c[uVar37];
                    puVar25[lVar33 * 4 + -2] =
                         pdVar8[uVar43].m_pixels[0][uVar35].field_0.c[uVar37 + 1];
                    puVar25[lVar33 * 4 + -1] =
                         pdVar8[uVar43].m_pixels[0][uVar35].field_0.c[uVar37 + 2];
                    puVar25[lVar33 * 4] = pdVar8[uVar43].m_pixels[0][uVar35].field_0.c[uVar37 + 3];
                    lVar33 = lVar33 + 1;
                  } while (lVar33 != 8);
                  lVar31 = lVar31 + 1;
                  puVar25 = puVar25 + 0x20;
                } while (lVar31 != 8);
                puVar39 = &local_408[0].m_values.m_size;
                lVar31 = 0;
                local_5d0 = uVar24;
                local_5c0 = lVar23;
                do {
                  uVar14 = (&DAT_001cf908)[lVar31 * 5];
                  iVar20 = (&DAT_001cf90c)[lVar31 * 5];
                  if (iVar20 != 0) {
                    uVar35 = (&g_chunk_tile_layouts)[lVar31 * 5] + (&DAT_001cf904)[lVar31 * 5] * 8;
                    uVar28 = 0;
                    iVar30 = 0;
                    uVar42 = (ulong)uVar14;
                    uVar43 = uVar35;
                    uVar32 = uVar28;
                    do {
                      for (; uVar42 != 0; uVar42 = uVar42 - 1) {
                        local_508[uVar28] =
                             *(anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)
                              (local_138.c + (ulong)uVar35 * 4);
                        uVar28 = uVar28 + 1;
                        uVar35 = uVar35 + 1;
                      }
                      iVar30 = iVar30 + 1;
                      uVar28 = uVar32 + uVar14;
                      uVar35 = uVar43 + 8;
                      uVar42 = (ulong)uVar14;
                      uVar43 = uVar35;
                      uVar32 = uVar28;
                    } while (iVar30 != iVar20);
                  }
                  uVar14 = iVar20 * uVar14;
                  lVar23 = lVar31 * 0x50;
                  dxt_fast::compress_alpha_block
                            (uVar14,(color_quad_u8 *)&local_508[0].field_0,
                             (uint *)((long)local_408 + lVar23),
                             (uint *)((long)local_408 + lVar23 + 4),
                             (uint8 *)((long)local_408 + lVar23 + 8),(this->m_params).m_comp_index);
                  dxt5_block::get_block_values
                            ((uint *)local_528,*(uint *)((long)local_408 + lVar23),
                             *(uint *)((long)local_408 + lVar23 + 4));
                  if (uVar14 == 0) {
                    lVar23 = 0;
                  }
                  else {
                    uVar42 = 0;
                    lVar23 = 0;
                    do {
                      lVar23 = lVar23 + (ulong)(((uint)local_508[0].c
                                                       [uVar42 * 4 +
                                                        (ulong)(this->m_params).m_comp_index] -
                                                *(int *)(local_528 +
                                                        (ulong)*(byte *)((long)puVar39 + uVar42) * 4
                                                        )) *
                                               ((uint)local_508[0].c
                                                      [uVar42 * 4 +
                                                       (ulong)(this->m_params).m_comp_index] -
                                               *(int *)(local_528 +
                                                       (ulong)*(byte *)((long)puVar39 + uVar42) * 4)
                                               ));
                      uVar42 = uVar42 + 1;
                    } while (uVar14 != uVar42);
                  }
                  local_3c0[lVar31 * 10] = lVar23;
                  lVar31 = lVar31 + 1;
                  puVar39 = puVar39 + 0x14;
                } while (lVar31 != 9);
                uVar37 = 0;
                dVar10 = -1.0;
                uVar42 = 0;
                puVar40 = local_588;
                do {
                  if ((ulong)(uint)(&g_chunk_encodings)[uVar37 * 0x15] == 0) {
                    dVar49 = 0.0;
                  }
                  else {
                    dVar49 = 0.0;
                    lVar23 = 0;
                    do {
                      dVar49 = dVar49 + ((double)CONCAT44(0x45300000,
                                                          (int)((ulong)local_3c0[(ulong)*(uint *)((
                                                  long)puVar40 + lVar23) * 10] >> 0x20)) -
                                        1.9342813113834067e+25) +
                                        ((double)CONCAT44(0x43300000,
                                                          (int)local_3c0[(ulong)*(uint *)((long)
                                                  puVar40 + lVar23) * 10]) - 4503599627370496.0);
                      lVar23 = lVar23 + 0x14;
                    } while ((ulong)(uint)(&g_chunk_encodings)[uVar37 * 0x15] * 0x14 != lVar23);
                    dVar49 = dVar49 * 0.015625;
                  }
                  if (dVar49 < 0.0) {
                    local_5f8 = dVar49;
                    dVar9 = sqrt(dVar49);
                    dVar49 = local_5f8;
                  }
                  else {
                    dVar9 = SQRT(dVar49);
                  }
                  uVar47 = 0;
                  uVar48 = 0x412e847e;
                  if ((dVar49 != 0.0) || (NAN(dVar49))) {
                    dVar49 = log10(255.0 / dVar9);
                    dVar49 = dVar49 * 20.0;
                    dVar9 = 500.0;
                    if (dVar49 <= 500.0) {
                      dVar9 = dVar49;
                    }
                    uVar29 = ~-(ulong)(dVar49 < 0.0) & (ulong)dVar9;
                    uVar47 = (undefined4)uVar29;
                    uVar48 = (undefined4)(uVar29 >> 0x20);
                  }
                  fVar46 = 2.4;
                  if (uVar18 != 0) {
                    local_5f8 = (double)CONCAT44(uVar48,uVar47);
                    uStack_5f0 = 0;
                    fVar45 = powf(3.0,(float)(uVar18 & 0xffffffff));
                    fVar46 = 0.25;
                    uVar47 = (undefined4)local_5f8;
                    uVar48 = local_5f8._4_4_;
                    if (0.25 <= 2.4 / fVar45) {
                      fVar46 = 2.4 / fVar45;
                    }
                  }
                  dVar49 = (double)CONCAT44(uVar48,uVar47) -
                           (double)(((float)((&g_chunk_encodings)[uVar37 * 0x15] - 1) / 3.0) *
                                    fVar46 + 0.0);
                  if (dVar10 < dVar49) {
                    uVar42 = uVar37 & 0xffffffff;
                    dVar10 = dVar49;
                  }
                  uVar37 = uVar37 + 1;
                  puVar40 = puVar40 + 0x15;
                } while (uVar37 != 8);
                piVar3 = (int *)((long)local_5b8 + uVar42 * 4);
                *piVar3 = *piVar3 + 1;
                if ((&g_chunk_encodings)[uVar42 * 0x15] != 0) {
                  local_578 = &DAT_001cf664 + uVar42 * 0x15;
                  uVar37 = 0;
                  local_580 = &g_chunk_encodings + uVar42 * 0x15;
                  do {
                    puVar40 = local_578;
                    local_568 = uVar37;
                    lVar23 = (ulong)(uint)local_578[uVar37 * 5 + 4] * 0x50;
                    dxt5_block::get_block_values
                              ((uint *)local_528,*(uint *)((long)local_408 + lVar23),
                               *(uint *)((long)local_408 + lVar23 + 4));
                    puVar2 = puVar40 + uVar37 * 5;
                    uVar14 = puVar2[3];
                    if (uVar14 != 0) {
                      iVar30 = 0;
                      uVar35 = 0;
                      iVar20 = local_648;
                      do {
                        uVar14 = puVar2[2];
                        if (uVar14 != 0) {
                          uVar43 = puVar2[1];
                          uVar28 = 0;
                          do {
                            uVar32 = *puVar2;
                            uVar34 = local_138.c
                                     [(ulong)(this->m_params).m_comp_index +
                                      (ulong)(iVar30 + uVar43 * 8 + uVar28 + uVar32) * 4];
                            uVar42 = (ulong)(uVar14 * uVar35 + uVar28);
                            local_508[0].c[uVar42 * 4] = uVar34;
                            local_508[0].c[uVar42 * 4 + 1] = uVar34;
                            local_508[0].c[uVar42 * 4 + 2] = uVar34;
                            local_508[0].c[uVar42 * 4 + 3] = 0xff;
                            iVar36 = *(int *)(local_528 +
                                             (ulong)*(byte *)((long)local_408 + uVar42 + lVar23 + 8)
                                             * 4);
                            if (0xfe < iVar36) {
                              iVar36 = 0xff;
                            }
                            if (iVar36 < 1) {
                              iVar36 = 0;
                            }
                            uVar14 = uVar32 + iVar41 + uVar28 +
                                     local_558.m_pitch * (uVar43 + iVar20);
                            uVar34 = (uchar)iVar36;
                            local_558.m_pPixels[uVar14].field_0.field_0.r = uVar34;
                            local_558.m_pPixels[uVar14].field_0.field_0.g = uVar34;
                            local_558.m_pPixels[uVar14].field_0.field_0.b = uVar34;
                            local_558.m_pPixels[uVar14].field_0.field_0.a = 0xff;
                            uVar28 = uVar28 + 1;
                            uVar14 = puVar2[2];
                          } while (uVar28 < uVar14);
                        }
                        uVar35 = uVar35 + 1;
                        uVar14 = puVar2[3];
                        iVar30 = iVar30 + 8;
                        iVar20 = iVar20 + 1;
                      } while (uVar35 < uVar14);
                    }
                    dxt_fast::find_representative_colors
                              (uVar14 * puVar2[2],(color_quad_u8 *)&local_508[0].field_0,
                               (color_quad_u8 *)&local_600.field_0,
                               (color_quad_u8 *)&local_604.field_0);
                    iVar20 = (uint)local_600.field_0.r - (uint)local_604.field_0.r;
                    uVar35 = iVar20 * iVar20;
                    uVar14 = uVar35 >> 3;
                    if (7 < uVar14) {
                      uVar14 = 8;
                    }
                    if (uVar35 < 8) {
                      uVar14 = 1;
                    }
                    uVar35 = puVar2[3];
                    if (3 < uVar35) {
                      uVar28 = puVar2[1] >> 2;
                      local_5f8 = (double)(ulong)uVar28;
                      uVar43 = pmVar1->m_block_height;
                      iVar20 = iVar21 + uVar28;
                      uVar32 = 0;
                      do {
                        if (((int)local_560 + uVar32 + uVar28 < uVar43) &&
                           (uVar5 = puVar2[2], 3 < uVar5)) {
                          uVar6 = pmVar1->m_block_width;
                          ppVar7 = (this_00->m_training_vecs).m_p;
                          iVar30 = (*puVar2 >> 2) + iVar17;
                          uVar44 = 0;
                          do {
                            if (uVar6 <= iVar30 + uVar44) break;
                            uVar26 = uVar6 * iVar20 + iVar30 + uVar44 + pmVar1->m_first_block;
                            ppVar7[uVar26].first.m_s[0] = (float)local_600._0_1_;
                            ppVar7[uVar26].first.m_s[1] = (float)local_604._0_1_;
                            ppVar7[uVar26].second = uVar14;
                            local_644 = local_644 + 1;
                            uVar44 = uVar44 + 1;
                          } while (uVar44 < uVar5 >> 2);
                        }
                        uVar32 = uVar32 + 1;
                        iVar20 = iVar20 + 1;
                      } while (uVar32 != uVar35 >> 2);
                    }
                    uVar37 = local_568 + 1;
                  } while (uVar37 < *local_580);
                }
                lVar23 = local_5c0;
                uVar42 = local_5c8;
                bVar11 = true;
                if (local_64c <= local_644) {
                  bVar11 = update_progress(this,local_644,this->m_num_blocks - 1);
                  local_64c = local_64c + 0x200;
                }
                uVar37 = local_5e0;
                uVar29 = local_5d8;
                if (bVar11 == false) {
                  cVar12 = '\x01';
                  goto LAB_001405db;
                }
                uVar24 = local_5d0 + 1;
                bVar13 = uVar24 < local_590;
                lVar23 = lVar23 + 8;
                iVar41 = iVar41 + 8;
                iVar17 = iVar17 + 2;
              } while (uVar24 != local_590);
              cVar12 = '\b';
            }
LAB_001405db:
            if (bVar13) goto LAB_00140608;
            uVar29 = uVar29 + 1;
            local_648 = local_648 + 8;
            iVar21 = iVar21 + 2;
          } while (uVar29 != uVar37);
          cVar12 = '\x05';
        }
LAB_00140608:
        if (cVar12 != '\x05') {
          if (cVar12 != '\0') goto LAB_00140902;
          break;
        }
        uVar18 = uVar18 + 1;
      } while (uVar18 < (this->m_params).m_num_mips);
    }
  }
  else {
    uVar18 = (ulong)this->m_num_blocks;
    if (this->m_num_blocks != 0) {
      lVar23 = 0;
      v = &local_138;
      uVar42 = 0;
      do {
        if (((uVar42 & 0x1ff) == 0) &&
           (bVar13 = update_progress(this,(uint)uVar42,(int)uVar18 - 1), !bVar13))
        goto LAB_00140902;
        puVar25 = this->m_pBlocks->m_pixels[0][0].field_0.c +
                  (ulong)(this->m_params).m_comp_index + lVar23;
        lVar31 = 0;
        puVar19 = (undefined1 *)((long)&local_408[0].m_values.m_p + 3);
        do {
          lVar33 = 0;
          do {
            uVar34 = puVar25[lVar33 * 4];
            puVar19[lVar33 * 4 + -3] = uVar34;
            puVar19[lVar33 * 4 + -2] = uVar34;
            puVar19[lVar33 * 4 + -1] = uVar34;
            puVar19[lVar33 * 4] = 0xff;
            lVar33 = lVar33 + 1;
          } while (lVar33 != 4);
          lVar31 = lVar31 + 1;
          puVar25 = puVar25 + 0x10;
          puVar19 = puVar19 + 0x10;
        } while (lVar31 != 4);
        dxt_fast::find_representative_colors
                  (0x10,(color_quad_u8 *)local_408,(color_quad_u8 *)&local_508[0].field_0,
                   (color_quad_u8 *)local_5b8);
        local_138 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
                    (float)(byte)local_508[0]._0_1_;
        iVar21 = (uint)(byte)local_508[0]._0_1_ - (uint)(byte)(undefined1)local_5b8[0];
        uVar16 = iVar21 * iVar21;
        uVar22 = uVar16 >> 3;
        if (7 < uVar22) {
          uVar22 = 8;
        }
        if (uVar16 < 8) {
          uVar22 = 1;
        }
        local_134 = (float)(byte)(undefined1)local_5b8[0];
        clusterizer<crnlib::vec<2U,_float>_>::add_training_vec
                  (this_00,(vec<2U,_float> *)&v->field_0,uVar22);
        uVar42 = uVar42 + 1;
        uVar18 = (ulong)this->m_num_blocks;
        lVar23 = lVar23 + 0x40;
      } while (uVar42 < uVar18);
    }
  }
  this->m_progress_start = 0x4b;
  this->m_progress_range = 0x14;
  bVar13 = clusterizer<crnlib::vec<2U,_float>_>::generate_codebook
                     (this_00,0xffff,generate_codebook_progress_callback,this,false);
  if (bVar13) {
    local_408[0].m_values.m_p = (raw_node *)0x0;
    local_408[0].m_values.m_size = 0;
    local_408[0].m_values.m_capacity = 0;
    local_408[0].m_hash_shift = 0x20;
    local_408[0].m_num_valid = 0;
    local_408[0].m_grow_threshold = 0;
    this->m_progress_start = 0x5f;
    this->m_progress_range = 5;
    uVar16 = this->m_num_blocks;
    uVar18 = (ulong)uVar16;
    uVar27 = CONCAT71((int7)((ulong)v >> 8),uVar16 == 0);
    iVar21 = (int)uVar27;
    if (uVar16 != 0) {
      uVar42 = 0;
      do {
        iVar21 = (int)uVar27;
        if (((uVar42 & 0x1ff) == 0) &&
           (bVar13 = update_progress(this,(uint)uVar42,(int)uVar18 - 1), !bVar13))
        goto LAB_001408a8;
        dxt_fast::compress_alpha_block
                  ((dxt5_block *)&local_508[0].field_0,(color_quad_u8 *)(this->m_pBlocks + uVar42),
                   (this->m_params).m_comp_index);
        local_5b8[0] = 0;
        lVar23 = 0;
        puVar25 = &local_508[0].field_0.b;
        local_5b8[0] = 0;
        do {
          local_5b8[0] = local_5b8[0] | (ulong)*puVar25 << ((byte)lVar23 & 0x3f);
          puVar25 = puVar25 + 1;
          lVar23 = lVar23 + 8;
        } while (lVar23 != 0x30);
        hash_map<unsigned_long_long,_crnlib::empty_type,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
        ::insert((insert_result *)&local_138.field_0,local_408,local_5b8,local_528);
        uVar42 = uVar42 + 1;
        uVar18 = (ulong)this->m_num_blocks;
        uVar27 = CONCAT71((int7)((ulong)uVar27 >> 8),uVar42 >= uVar18);
        iVar21 = (int)uVar27;
      } while (uVar42 < uVar18);
    }
    this->m_max_selector_clusters = local_408[0].m_num_valid + 0x80;
    update_progress(this,1,1);
LAB_001408a8:
    if (local_408[0].m_values.m_size != 0) {
      if (local_408[0].m_values.m_p != (raw_node *)0x0) {
        crnlib_free(local_408[0].m_values.m_p);
        local_408[0].m_values.m_p = (raw_node *)0x0;
        local_408[0].m_values.m_size = 0;
        local_408[0].m_values.m_capacity = 0;
      }
      local_408[0].m_hash_shift = 0x20;
      local_408[0].m_num_valid = 0;
      local_408[0].m_grow_threshold = 0;
    }
    if (local_408[0].m_values.m_p != (raw_node *)0x0) {
      crnlib_free(local_408[0].m_values.m_p);
    }
  }
  else {
LAB_00140902:
    iVar21 = 0;
  }
  if (local_558.m_pixel_buf.m_p != (color_quad<unsigned_char,_int> *)0x0) {
    crnlib_free(local_558.m_pixel_buf.m_p);
  }
  return iVar21;
}

Assistant:

bool qdxt5::init(uint n, const dxt_pixel_block* pBlocks, const qdxt5_params& params)
    {
        clear();

        CRNLIB_ASSERT(n && pBlocks);

        m_main_thread_id = crn_get_current_thread_id();

        m_num_blocks = n;
        m_pBlocks = pBlocks;
        m_params = params;

        m_endpoint_clusterizer.reserve_training_vecs(m_num_blocks);

        m_progress_start = 0;
        m_progress_range = 75;

        image_u8 debug_img;

        const bool debugging = true;

        if ((m_params.m_hierarchical) && (m_params.m_num_mips))
        {
            vec2F_clusterizer::training_vec_array& training_vecs = m_endpoint_clusterizer.get_training_vecs();
            training_vecs.resize(m_num_blocks);

            uint encoding_hist[cNumChunkEncodings];
            utils::zero_object(encoding_hist);

            uint total_processed_blocks = 0;
            uint next_progress_threshold = 512;

            for (uint level = 0; level < m_params.m_num_mips; level++)
            {
                const qdxt5_params::mip_desc& level_desc = m_params.m_mip_desc[level];

                const uint num_chunks_x = (level_desc.m_block_width + cChunkBlockWidth - 1) / cChunkBlockWidth;
                const uint num_chunks_y = (level_desc.m_block_height + cChunkBlockHeight - 1) / cChunkBlockHeight;

                const uint level_width = level_desc.m_block_width * 4;
                const uint level_height = level_desc.m_block_height * 4;

                if (debugging)
                {
                    debug_img.resize(num_chunks_x * cChunkPixelWidth, num_chunks_y * cChunkPixelHeight);
                }

                for (uint chunk_y = 0; chunk_y < num_chunks_y; chunk_y++)
                {
                    for (uint chunk_x = 0; chunk_x < num_chunks_x; chunk_x++)
                    {
                        color_quad_u8 chunk_pixels[cChunkPixelWidth * cChunkPixelHeight];

                        for (uint y = 0; y < cChunkPixelHeight; y++)
                        {
                            const uint pix_y = math::minimum<uint>(chunk_y * cChunkPixelHeight + y, level_height - 1);

                            const uint outer_block_index = level_desc.m_first_block + ((pix_y >> 2) * level_desc.m_block_width);

                            for (uint x = 0; x < cChunkPixelWidth; x++)
                            {
                                const uint pix_x = math::minimum<uint>(chunk_x * cChunkPixelWidth + x, level_width - 1);

                                const uint block_index = outer_block_index + (pix_x >> 2);

                                const dxt_pixel_block& block = m_pBlocks[block_index];

                                const color_quad_u8& p = block.m_pixels[pix_y & 3][pix_x & 3];

                                chunk_pixels[x + y * 8] = p;
                            }
                        }

                        struct layout_results
                        {
                            uint m_low_color;
                            uint m_high_color;
                            uint8 m_selectors[cChunkPixelWidth * cChunkPixelHeight];
                            uint64 m_error;
                            //float m_penalty;
                        };
                        layout_results layouts[cNumChunkTileLayouts];

                        for (uint l = 0; l < cNumChunkTileLayouts; l++)
                        {
                            const uint width = g_chunk_tile_layouts[l].m_width;
                            const uint height = g_chunk_tile_layouts[l].m_height;
                            const uint x_ofs = g_chunk_tile_layouts[l].m_x_ofs;
                            const uint y_ofs = g_chunk_tile_layouts[l].m_y_ofs;

                            color_quad_u8 layout_pixels[cChunkPixelWidth * cChunkPixelHeight];
                            for (uint y = 0; y < height; y++)
                            {
                                for (uint x = 0; x < width; x++)
                                {
                                    layout_pixels[x + y * width] = chunk_pixels[(x_ofs + x) + (y_ofs + y) * cChunkPixelWidth];
                                }
                            }

                            const uint n = width * height;
                            dxt_fast::compress_alpha_block(n, layout_pixels, layouts[l].m_low_color, layouts[l].m_high_color, layouts[l].m_selectors, m_params.m_comp_index);

                            uint c[dxt5_block::cMaxSelectorValues];
                            dxt5_block::get_block_values(c, layouts[l].m_low_color, layouts[l].m_high_color);

                            uint64 error = 0;
                            for (uint i = 0; i < n; i++)
                            {
                                error += math::square((int)layout_pixels[i][m_params.m_comp_index] - (int)c[layouts[l].m_selectors[i]]);
                            }

                            layouts[l].m_error = error;
                        }

                        double best_peak_snr = -1.0f;
                        uint best_encoding = 0;

                        for (uint e = 0; e < cNumChunkEncodings; e++)
                        {
                            const chunk_encoding_desc& encoding_desc = g_chunk_encodings[e];

                            double total_error = 0;

                            for (uint t = 0; t < encoding_desc.m_num_tiles; t++)
                            {
                                total_error += (double)layouts[encoding_desc.m_tiles[t].m_layout_index].m_error;
                            }

                            double mean_squared = total_error * (1.0f / 64.0f);
                            double root_mean_squared = sqrt(mean_squared);

                            double peak_snr = 999999.0f;
                            if (mean_squared)
                            {
                                peak_snr = math::clamp<double>(log10(255.0f / root_mean_squared) * 20.0f, 0.0f, 500.0f);
                            }

                            float adaptive_tile_alpha_psnr_derating = 2.4f;
                            //if (level)
                            //   adaptive_tile_alpha_psnr_derating = math::lerp(adaptive_tile_alpha_psnr_derating * .5f, .3f, math::maximum((level - 1) / float(m_params.m_num_mips - 2), 1.0f));
                            if ((level) && (adaptive_tile_alpha_psnr_derating > .25f))
                            {
                                adaptive_tile_alpha_psnr_derating = math::maximum(.25f, adaptive_tile_alpha_psnr_derating / powf(3.0f, static_cast<float>(level)));
                            }

                            float alpha_derating = math::lerp(0.0f, adaptive_tile_alpha_psnr_derating, (g_chunk_encodings[e].m_num_tiles - 1) / 3.0f);
                            peak_snr = peak_snr - alpha_derating;

                            //for (uint t = 0; t < encoding_desc.m_num_tiles; t++)
                            //   peak_snr -= (double)layouts[encoding_desc.m_tiles[t].m_layout_index].m_penalty;

                            if (peak_snr > best_peak_snr)
                            {
                                best_peak_snr = peak_snr;
                                best_encoding = e;
                            }
                        }

                        encoding_hist[best_encoding]++;

                        const chunk_encoding_desc& encoding_desc = g_chunk_encodings[best_encoding];

                        for (uint t = 0; t < encoding_desc.m_num_tiles; t++)
                        {
                            const chunk_tile_desc& tile_desc = encoding_desc.m_tiles[t];

                            uint layout_index = tile_desc.m_layout_index;
                            const layout_results& layout = layouts[layout_index];

                            uint c[dxt5_block::cMaxSelectorValues];
                            if (debugging)
                            {
                                dxt5_block::get_block_values(c, layout.m_low_color, layout.m_high_color);
                            }

                            color_quad_u8 tile_pixels[cChunkPixelWidth * cChunkPixelHeight];

                            for (uint y = 0; y < tile_desc.m_height; y++)
                            {
                                const uint pix_y = y + tile_desc.m_y_ofs;

                                for (uint x = 0; x < tile_desc.m_width; x++)
                                {
                                    const uint pix_x = x + tile_desc.m_x_ofs;

                                    uint a = chunk_pixels[pix_x + pix_y * cChunkPixelWidth][m_params.m_comp_index];

                                    tile_pixels[x + y * tile_desc.m_width].set(a, a, a, 255);

                                    if (debugging)
                                    {
                                        debug_img(chunk_x * 8 + pix_x, chunk_y * 8 + pix_y) = c[layout.m_selectors[x + y * tile_desc.m_width]];
                                    }
                                }
                            }

                            color_quad_u8 l, h;
                            dxt_fast::find_representative_colors(tile_desc.m_width * tile_desc.m_height, tile_pixels, l, h);

                            const uint dist = math::square<int>((int)l[0] - (int)h[0]);

                            const int cAlphaErrorToWeight = 8;
                            const uint cMaxWeight = 8;
                            uint weight = math::clamp<uint>(dist / cAlphaErrorToWeight, 1, cMaxWeight);

                            vec2F ev;

                            ev[0] = l[0];
                            ev[1] = h[0];

                            for (uint y = 0; y < (tile_desc.m_height >> 2); y++)
                            {
                                uint block_y = chunk_y * cChunkBlockHeight + y + (tile_desc.m_y_ofs >> 2);
                                if (block_y >= level_desc.m_block_height)
                                {
                                    continue;
                                }

                                for (uint x = 0; x < (tile_desc.m_width >> 2); x++)
                                {
                                    uint block_x = chunk_x * cChunkBlockWidth + x + (tile_desc.m_x_ofs >> 2);
                                    if (block_x >= level_desc.m_block_width)
                                    {
                                        break;
                                    }

                                    uint block_index = level_desc.m_first_block + block_x + block_y * level_desc.m_block_width;

                                    training_vecs[block_index].first = ev;
                                    training_vecs[block_index].second = weight;

                                    total_processed_blocks++;

                                } // x
                            } // y
                        } //t

                        if (total_processed_blocks >= next_progress_threshold)
                        {
                            next_progress_threshold += 512;

                            if (!update_progress(total_processed_blocks, m_num_blocks - 1))
                            {
                                return false;
                            }
                        }

                    } // chunk_x
                } // chunk_y

#if QDXT5_DEBUGGING
                if (debugging)
                    image_utils::write_to_file(dynamic_wstring(cVarArg, "debug_%u.tga", level).get_ptr(), debug_img, image_utils::cWriteFlagIgnoreAlpha);
#endif

            } // level

#if 0
         trace("chunk encoding hist: ");
         for (uint i = 0; i < cNumChunkEncodings; i++)
            trace("%u ", encoding_hist[i]);
         trace("\n");
#endif
        }
        else
        {
            for (uint block_index = 0; block_index < m_num_blocks; block_index++)
            {
                if ((block_index & 511) == 0)
                {
                    if (!update_progress(block_index, m_num_blocks - 1))
                    {
                        return false;
                    }
                }

                color_quad_u8 c[16];
                for (uint y = 0; y < cDXTBlockSize; y++)
                {
                    for (uint x = 0; x < cDXTBlockSize; x++)
                    {
                        c[x + y * cDXTBlockSize].set(m_pBlocks[block_index].m_pixels[y][x][m_params.m_comp_index], 255);
                    }
                }

                color_quad_u8 l, h;
                dxt_fast::find_representative_colors(cDXTBlockSize * cDXTBlockSize, c, l, h);

                const uint dist = math::square<int>((int)l[0] - (int)h[0]);

                const int cAlphaErrorToWeight = 8;
                const uint cMaxWeight = 8;
                uint weight = math::clamp<uint>(dist / cAlphaErrorToWeight, 1, cMaxWeight);

                vec2F ev;

                ev[0] = l[0];
                ev[1] = h[0];

                m_endpoint_clusterizer.add_training_vec(ev, weight);
            }
        }

        const uint cMaxEndpointClusters = 65535U;

        m_progress_start = 75;
        m_progress_range = 20;

        if (!m_endpoint_clusterizer.generate_codebook(cMaxEndpointClusters, generate_codebook_progress_callback, this))
        {
            return false;
        }

        crnlib::hash_map<uint64, empty_type> selector_hash;

        m_progress_start = 95;
        m_progress_range = 5;

        for (uint block_index = 0; block_index < m_num_blocks; block_index++)
        {
            if ((block_index & 511) == 0)
            {
                if (!update_progress(block_index, m_num_blocks - 1))
                {
                    return false;
                }
            }

            dxt5_block dxt_blk;
            dxt_fast::compress_alpha_block(&dxt_blk, &m_pBlocks[block_index].m_pixels[0][0], m_params.m_comp_index);

            uint64 selectors = 0;
            for (uint i = 0; i < dxt5_block::cNumSelectorBytes; i++)
            {
                selectors |= static_cast<uint64>(dxt_blk.m_selectors[i]) << (i * 8U);
            }

            selector_hash.insert(selectors);
        }

        m_max_selector_clusters = selector_hash.size() + 128;

        update_progress(1, 1);

        return true;
    }